

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ditBuildInfoTests.cpp
# Opt level: O0

char * dit::getCompilerName(int compiler)

{
  char *pcStack_10;
  int compiler_local;
  
  switch(compiler) {
  case 0:
    pcStack_10 = "DE_COMPILER_VANILLA";
    break;
  case 1:
    pcStack_10 = "DE_COMPILER_MSC";
    break;
  case 2:
    pcStack_10 = "DE_COMPILER_GCC";
    break;
  case 3:
    pcStack_10 = "DE_COMPILER_CLANG";
    break;
  default:
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

static const char* getCompilerName (int compiler)
{
	switch (compiler)
	{
		case DE_COMPILER_VANILLA:	return "DE_COMPILER_VANILLA";
		case DE_COMPILER_MSC:		return "DE_COMPILER_MSC";
		case DE_COMPILER_GCC:		return "DE_COMPILER_GCC";
		case DE_COMPILER_CLANG:		return "DE_COMPILER_CLANG";
		default:
			return DE_NULL;
	}
}